

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool wallet::LoadKey(CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  bool bVar1;
  uchar *puVar2;
  LegacyDataSPKM *this;
  size_t __nbytes;
  char *__s;
  CPubKey *this_00;
  long lVar3;
  size_type __len2;
  pointer *__ptr;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Span<unsigned_char> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchKey;
  CPrivKey pkey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  uint256 result;
  uint256 hash;
  CPubKey vchPubKey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  undefined1 local_178 [16];
  pointer local_168;
  undefined1 local_158 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_150;
  unique_lock<std::recursive_mutex> local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  uchar local_f8 [15];
  undefined1 local_e9 [65];
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_148._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_148._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_148);
  this_00 = (CPubKey *)local_e9;
  local_e9[0] = 0xff;
  CPubKey::Unserialize<DataStream>(this_00,ssKey);
  __nbytes = (ulong)local_e9[0] & 0xfffffffffffffffe;
  if (((char)__nbytes != '\x02') &&
     ((7 < local_e9[0] || (__nbytes = 0xd0, (0xd0U >> (local_e9[0] & 0x1f) & 1) == 0)))) {
    bVar4 = false;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (strErr,0,strErr->_M_string_length,"Error reading wallet database: CPubKey corrupt",
               0x2e);
    goto LAB_001ac105;
  }
  local_158[0] = false;
  local_150._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  local_168 = (pointer)0x0;
  local_178 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  DataStream::operator>>
            (ssValue,(vector<unsigned_char,_secure_allocator<unsigned_char>_> *)local_178);
  DataStream::read(ssValue,(int)local_118,(void *)0x20,__nbytes);
  puVar2 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (local_118,local_f8);
  if (puVar2 == local_f8) {
LAB_001ac075:
    bVar4 = CKey::Load((CKey *)local_158,(CPrivKey *)local_178,(CPubKey *)local_e9,
                       puVar2 != local_f8);
    if (bVar4) {
      this = CWallet::GetOrCreateLegacyDataSPKM(pwallet);
      bVar1 = LegacyDataSPKM::LoadKey(this,(CKey *)local_158,(CPubKey *)local_e9);
      bVar4 = true;
      if (bVar1) goto LAB_001ac0e9;
      __len2 = 0x3d;
      __s = "Error reading wallet database: LegacyDataSPKM::LoadKey failed";
    }
    else {
      __len2 = 0x2f;
      __s = "Error reading wallet database: CPrivKey corrupt";
    }
    bVar4 = false;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (strErr,0,strErr->_M_string_length,__s,__len2);
  }
  else {
    local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar3 = 0x21;
    if ((local_e9[0] & 0xfe) != 2) {
      if ((byte)(local_e9[0] - 4) < 4) {
        lVar3 = *(long *)(&DAT_004a5780 + (ulong)(byte)(local_e9[0] - 4) * 8);
      }
      else {
        lVar3 = 0;
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_198,(size_type)(local_178._8_8_ + (lVar3 - local_178._0_8_)));
    if ((local_e9[0] & 0xfe) == 2) {
      this_00 = (CPubKey *)(local_e9 + 0x21);
    }
    else if ((local_e9[0] < 8) && ((0xd0U >> (local_e9[0] & 0x1f) & 1) != 0)) {
      this_00 = (CPubKey *)local_a8;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_198,
               local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,local_e9,this_00);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_198,
               local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,local_178._0_8_,local_178._8_8_);
    local_128 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_a8._16_16_ = (undefined1  [16])0x0;
    local_a8._0_16_ = (undefined1  [16])0x0;
    local_48 = 0;
    CSHA256::CSHA256((CSHA256 *)local_a8);
    CSHA256::Write((CSHA256 *)local_a8,
                   local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    output.m_size = 0x20;
    output.m_data = local_138;
    CHash256::Finalize((CHash256 *)local_a8,output);
    auVar5[0] = -(local_128[0] == local_108[0]);
    auVar5[1] = -(local_128[1] == local_108[1]);
    auVar5[2] = -(local_128[2] == local_108[2]);
    auVar5[3] = -(local_128[3] == local_108[3]);
    auVar5[4] = -(local_128[4] == local_108[4]);
    auVar5[5] = -(local_128[5] == local_108[5]);
    auVar5[6] = -(local_128[6] == local_108[6]);
    auVar5[7] = -(local_128[7] == local_108[7]);
    auVar5[8] = -(local_128[8] == local_108[8]);
    auVar5[9] = -(local_128[9] == local_108[9]);
    auVar5[10] = -(local_128[10] == local_108[10]);
    auVar5[0xb] = -(local_128[0xb] == local_108[0xb]);
    auVar5[0xc] = -(local_128[0xc] == local_108[0xc]);
    auVar5[0xd] = -(local_128[0xd] == local_108[0xd]);
    auVar5[0xe] = -(local_128[0xe] == local_108[0xe]);
    auVar5[0xf] = -(local_128[0xf] == local_108[0xf]);
    auVar6[0] = -(local_138[0] == local_118[0]);
    auVar6[1] = -(local_138[1] == local_118[1]);
    auVar6[2] = -(local_138[2] == local_118[2]);
    auVar6[3] = -(local_138[3] == local_118[3]);
    auVar6[4] = -(local_138[4] == local_118[4]);
    auVar6[5] = -(local_138[5] == local_118[5]);
    auVar6[6] = -(local_138[6] == local_118[6]);
    auVar6[7] = -(local_138[7] == local_118[7]);
    auVar6[8] = -(local_138[8] == local_118[8]);
    auVar6[9] = -(local_138[9] == local_118[9]);
    auVar6[10] = -(local_138[10] == local_118[10]);
    auVar6[0xb] = -(local_138[0xb] == local_118[0xb]);
    auVar6[0xc] = -(local_138[0xc] == local_118[0xc]);
    auVar6[0xd] = -(local_138[0xd] == local_118[0xd]);
    auVar6[0xe] = -(local_138[0xe] == local_118[0xe]);
    auVar6[0xf] = -(local_138[0xf] == local_118[0xf]);
    auVar6 = auVar6 & auVar5;
    bVar4 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
    if (!bVar4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (strErr,0,strErr->_M_string_length,
                 "Error reading wallet database: CPubKey/CPrivKey corrupt",0x37);
    }
    if (local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_198.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar4) goto LAB_001ac075;
    bVar4 = false;
  }
LAB_001ac0e9:
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)local_178);
  if (local_150._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_150,
               local_150._M_head_impl);
  }
LAB_001ac105:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_148);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CPubKey vchPubKey;
        ssKey >> vchPubKey;
        if (!vchPubKey.IsValid())
        {
            strErr = "Error reading wallet database: CPubKey corrupt";
            return false;
        }
        CKey key;
        CPrivKey pkey;
        uint256 hash;

        ssValue >> pkey;

        // Old wallets store keys as DBKeys::KEY [pubkey] => [privkey]
        // ... which was slow for wallets with lots of keys, because the public key is re-derived from the private key
        // using EC operations as a checksum.
        // Newer wallets store keys as DBKeys::KEY [pubkey] => [privkey][hash(pubkey,privkey)], which is much faster while
        // remaining backwards-compatible.
        try
        {
            ssValue >> hash;
        }
        catch (const std::ios_base::failure&) {}

        bool fSkipCheck = false;

        if (!hash.IsNull())
        {
            // hash pubkey/privkey to accelerate wallet load
            std::vector<unsigned char> vchKey;
            vchKey.reserve(vchPubKey.size() + pkey.size());
            vchKey.insert(vchKey.end(), vchPubKey.begin(), vchPubKey.end());
            vchKey.insert(vchKey.end(), pkey.begin(), pkey.end());

            if (Hash(vchKey) != hash)
            {
                strErr = "Error reading wallet database: CPubKey/CPrivKey corrupt";
                return false;
            }

            fSkipCheck = true;
        }

        if (!key.Load(pkey, vchPubKey, fSkipCheck))
        {
            strErr = "Error reading wallet database: CPrivKey corrupt";
            return false;
        }
        if (!pwallet->GetOrCreateLegacyDataSPKM()->LoadKey(key, vchPubKey))
        {
            strErr = "Error reading wallet database: LegacyDataSPKM::LoadKey failed";
            return false;
        }
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}